

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editline.c
# Opt level: O2

el_status_t c_complete(void)

{
  el_status_t eVar1;
  char *token;
  byte *__s;
  size_t sVar2;
  byte *p;
  void *pvVar3;
  byte bVar4;
  byte *pbVar5;
  int unique;
  byte *local_40;
  size_t local_38;
  
  if (rl_inhibit_complete != 0) {
    return CSdispatch;
  }
  token = el_find_word();
  __s = (byte *)rl_complete(token,&unique);
  free(token);
  if (__s != (byte *)0x0) {
    sVar2 = strlen((char *)__s);
    p = (byte *)malloc(sVar2 * 2 + 1);
    pbVar5 = p;
    local_40 = __s;
    local_38 = sVar2;
    if (p == (byte *)0x0) {
      free(__s);
      return CSstay;
    }
    for (; bVar4 = *__s, bVar4 != 0; __s = __s + 1) {
      if ((((char)bVar4 < ' ') ||
          (pvVar3 = memchr("\"#$&\'()*:;<=>?[\\]^`{|}~\n\t ",(uint)bVar4,0x1b),
          pvVar3 != (void *)0x0)) && ((unique == 0 || (__s[1] != 0)))) {
        *pbVar5 = 0x5c;
        pbVar5 = pbVar5 + 1;
        bVar4 = *__s;
      }
      *pbVar5 = bVar4;
      pbVar5 = pbVar5 + 1;
    }
    *pbVar5 = 0;
    free(local_40);
    sVar2 = local_38;
    if (local_38 == 0) {
      eVar1 = CSdone;
    }
    else {
      eVar1 = insert_string((char *)p);
    }
    free(p);
    if (sVar2 != 0) {
      return eVar1;
    }
  }
  eVar1 = c_possible();
  return eVar1;
}

Assistant:

static el_status_t c_complete(void)
{
    char        *p, *q;
    char        *word, *string;
    size_t      len;
    int         unique;
    el_status_t s = CSdone;

    if (rl_inhibit_complete)
        return CSdispatch;

    word = el_find_word();
    p = rl_complete(word, &unique);
    if (word)
        free(word);
    if (p) {
        len = strlen(p);
        word = p;

        string = q = malloc(sizeof(char) * (2 * len + 1));
        if (!string) {
            free(word);
            return CSstay;
        }

        while (*p) {
            if ((*p < ' ' || strchr(SEPS, *p) != NULL)
                && (!unique || p[1] != 0)) {
                *q++ = '\\';
            }
            *q++ = *p++;
        }
        *q = '\0';
        free(word);

        if (len > 0) {
            s = insert_string(string);
#ifdef CONFIG_TERMINAL_BELL
            if (!unique)
                el_ring_bell();
#endif
        }
        free(string);

        if (len > 0)
            return s;
    }

    return c_possible();
}